

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O0

GLRState * __thiscall GLRParser::findState(GLRParser *this,string *stateName)

{
  GLRState *this_00;
  bool bVar1;
  __type _Var2;
  reference ppGVar3;
  string *__lhs;
  GLRState *state;
  iterator __end1;
  iterator __begin1;
  set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_> *__range1;
  string *stateName_local;
  GLRParser *this_local;
  
  bVar1 = std::operator==(stateName,"accept");
  if (bVar1) {
    this_local = (GLRParser *)this->acceptState;
  }
  else {
    __end1 = std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::begin
                       (&this->states);
    state = (GLRState *)
            std::set<GLRState_*,_std::less<GLRState_*>,_std::allocator<GLRState_*>_>::end
                      (&this->states);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&state), bVar1) {
      ppGVar3 = std::_Rb_tree_const_iterator<GLRState_*>::operator*(&__end1);
      this_00 = *ppGVar3;
      __lhs = GLRState::getName_abi_cxx11_(this_00);
      _Var2 = std::operator==(__lhs,stateName);
      if (_Var2) {
        return this_00;
      }
      std::_Rb_tree_const_iterator<GLRState_*>::operator++(&__end1);
    }
    this_local = (GLRParser *)0x0;
  }
  return (GLRState *)this_local;
}

Assistant:

GLRState *GLRParser::findState(const std::string &stateName) {
//    return *std::find(states.begin(), states.end(), stateName);
    if (stateName == "accept") {
        return acceptState;
    }


    for (GLRState *state: states) {
        if (state->getName() == stateName) {
            return state;
        }
    }


    return nullptr;
}